

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_notEqual_bvec3(ShaderEvalContext *c)

{
  float fVar1;
  int i;
  long lVar2;
  Vector<bool,_3> res_1;
  Vector<bool,_3> res;
  Vector<bool,_3> res_2;
  Vector<float,_3> res_3;
  float local_50 [4];
  undefined8 local_40;
  float local_38;
  float local_30 [4];
  undefined8 local_20;
  int aiStack_18 [6];
  
  local_30[3] = c->in[0].m_data[2];
  local_20 = *(undefined8 *)c->in[0].m_data;
  local_30[2] = 0.0;
  local_30[0] = 0.0;
  local_30[1] = 0.0;
  res.m_data[0] = false;
  res.m_data[1] = false;
  res.m_data[2] = false;
  lVar2 = 0;
  do {
    res.m_data[lVar2] =
         local_30[lVar2] <= local_30[lVar2 + 3] && local_30[lVar2 + 3] != local_30[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_40 = *(undefined8 *)(c->in[1].m_data + 1);
  local_38 = c->in[1].m_data[0];
  local_50[2] = 0.0;
  local_50[0] = 0.0;
  local_50[1] = 0.0;
  res_1.m_data[0] = false;
  res_1.m_data[1] = false;
  res_1.m_data[2] = false;
  lVar2 = 0;
  do {
    fVar1 = *(float *)((long)&local_40 + lVar2 * 4);
    res_1.m_data[lVar2] = local_50[lVar2] <= fVar1 && fVar1 != local_50[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  res_2.m_data[2] = false;
  res_2.m_data[0] = false;
  res_2.m_data[1] = false;
  lVar2 = 0;
  do {
    res_2.m_data[lVar2] = res.m_data[lVar2] != res_1.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  res_3.m_data[2] = 0.0;
  res_3.m_data[0] = 0.0;
  res_3.m_data[1] = 0.0;
  lVar2 = 0;
  do {
    res_3.m_data[lVar2] = (float)(int)res_2.m_data[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar2 = 2;
  do {
    (c->color).m_data[aiStack_18[lVar2]] = *(float *)((long)&res + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 5);
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }